

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void mg_template(mg_connection *conn,char *s,mg_expansion *expansions)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *kw;
  long lVar8;
  char *__s;
  long lVar9;
  mg_expansion *pmVar10;
  connection *conn_1;
  
  if (*s == '\0') {
    iVar5 = 0;
    lVar9 = 0;
  }
  else {
    bVar2 = false;
    iVar5 = 0;
    lVar8 = 0;
    do {
      bVar1 = true;
      iVar6 = (int)lVar8;
      iVar7 = iVar5;
      if (!bVar2) {
        if (*(short *)(s + lVar8) == 0x7b7b) {
          iVar7 = iVar6;
          if (iVar5 < lVar8) {
            terminate_headers(conn);
            write_chunk((connection *)&conn[-1].callback_param,s + iVar5,iVar6 - iVar5);
          }
        }
        else {
          bVar1 = false;
        }
      }
      bVar2 = false;
      iVar5 = iVar7;
      if (bVar1) {
        if (*(short *)(s + lVar8) == 0x7d7d) {
          __s = expansions->keyword;
          if (__s != (char *)0x0) {
            pmVar10 = expansions + 1;
            do {
              sVar4 = strlen(__s);
              iVar5 = iVar6 - (iVar7 + 2);
              bVar1 = true;
              if ((iVar5 == (int)sVar4) &&
                 (iVar5 = bcmp(__s,s + (iVar7 + 2),(long)iVar5), iVar5 == 0)) {
                (*pmVar10[-1].handler)(conn);
                bVar1 = false;
                iVar7 = iVar6 + 2;
              }
              iVar5 = iVar7;
              if (!bVar1) break;
              __s = pmVar10->keyword;
              pmVar10 = pmVar10 + 1;
            } while (__s != (char *)0x0);
          }
        }
        else {
          bVar2 = true;
        }
      }
      lVar9 = lVar8 + 1;
      lVar3 = lVar8 + 1;
      lVar8 = lVar9;
    } while (s[lVar3] != '\0');
  }
  iVar7 = (int)lVar9 - iVar5;
  if (iVar7 == 0 || (int)lVar9 < iVar5) {
    return;
  }
  terminate_headers(conn);
  write_chunk((connection *)&conn[-1].callback_param,s + iVar5,iVar7);
  return;
}

Assistant:

void mg_template(struct mg_connection *conn, const char *s,
                 struct mg_expansion *expansions) {
  int i, j, pos = 0, inside_marker = 0;

  for (i = 0; s[i] != '\0'; i++) {
    if (inside_marker == 0 && !memcmp(&s[i], "{{", 2)) {
      if (i > pos) {
        mg_send_data(conn, &s[pos], i - pos);
      }
      pos = i;
      inside_marker = 1;
    }
    if (inside_marker == 1 && !memcmp(&s[i], "}}", 2)) {
      for (j = 0; expansions[j].keyword != NULL; j++) {
        const char *kw = expansions[j].keyword;
        if ((int) strlen(kw) == i - (pos + 2) &&
            memcmp(kw, &s[pos + 2], i - (pos + 2)) == 0) {
          expansions[j].handler(conn);
          pos = i + 2;
          break;
        }
      }
      inside_marker = 0;
    }
  }
  if (i > pos) {
    mg_send_data(conn, &s[pos], i - pos);
  }
}